

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O1

int archive_compressor_gzip_close(archive_write_filter *f)

{
  private_data_conflict5 *data;
  int iVar1;
  int iVar2;
  uchar trailer [8];
  undefined4 local_20;
  undefined4 local_1c;
  
  data = (private_data_conflict5 *)f->data;
  iVar1 = drive_compressor(f,data,1);
  if (iVar1 == 0) {
    iVar1 = __archive_write_filter
                      (f->next_filter,data->compressed,
                       data->compressed_buffer_size - (ulong)(data->stream).avail_out);
  }
  if (iVar1 == 0) {
    local_20 = (undefined4)data->crc;
    local_1c = (undefined4)data->total_in;
    iVar1 = __archive_write_filter(f->next_filter,&local_20,8);
  }
  iVar2 = deflateEnd(&data->stream);
  if (iVar2 != 0) {
    archive_set_error(f->archive,-1,"Failed to clean up compressor");
    iVar1 = -0x1e;
  }
  return iVar1;
}

Assistant:

static int
archive_compressor_gzip_close(struct archive_write_filter *f)
{
	unsigned char trailer[8];
	struct private_data *data = (struct private_data *)f->data;
	int ret;

	/* Finish compression cycle */
	ret = drive_compressor(f, data, 1);
	if (ret == ARCHIVE_OK) {
		/* Write the last compressed data. */
		ret = __archive_write_filter(f->next_filter,
		    data->compressed,
		    data->compressed_buffer_size - data->stream.avail_out);
	}
	if (ret == ARCHIVE_OK) {
		/* Build and write out 8-byte trailer. */
		trailer[0] = (uint8_t)(data->crc)&0xff;
		trailer[1] = (uint8_t)(data->crc >> 8)&0xff;
		trailer[2] = (uint8_t)(data->crc >> 16)&0xff;
		trailer[3] = (uint8_t)(data->crc >> 24)&0xff;
		trailer[4] = (uint8_t)(data->total_in)&0xff;
		trailer[5] = (uint8_t)(data->total_in >> 8)&0xff;
		trailer[6] = (uint8_t)(data->total_in >> 16)&0xff;
		trailer[7] = (uint8_t)(data->total_in >> 24)&0xff;
		ret = __archive_write_filter(f->next_filter, trailer, 8);
	}

	switch (deflateEnd(&(data->stream))) {
	case Z_OK:
		break;
	default:
		archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
		    "Failed to clean up compressor");
		ret = ARCHIVE_FATAL;
	}
	return ret;
}